

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

int __thiscall QTextCursorPrivate::remove(QTextCursorPrivate *this,char *__filename)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  QTextDocumentPrivate *pQVar4;
  QTextTable *table;
  long in_FS_OFFSET;
  int numCols;
  int numRows;
  int startCol;
  int startRow;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->position;
  if (this->anchor != uVar1) {
    this->currentCharFormat = -1;
    uVar2 = this->adjusted_anchor;
    table = complexSelectionTable(this);
    if (table == (QTextTable *)0x0) {
      if ((int)uVar1 < (int)uVar2) {
        uVar2 = uVar1;
      }
      QTextDocumentPrivate::remove(this->priv,(char *)(ulong)uVar2);
      this->anchor = this->position;
      this->adjusted_anchor = this->position;
    }
    else {
      pQVar4 = this->priv;
      iVar3 = pQVar4->editBlock;
      pQVar4->editBlock = iVar3 + 1;
      if (iVar3 == 0) {
        pQVar4->revision = pQVar4->revision + 1;
      }
      local_3c = -0x55555556;
      local_40 = -0x55555556;
      local_44 = -0x55555556;
      local_48 = -0x55555556;
      selectedTableCells(this,&local_3c,&local_44,&local_40,&local_48);
      clearCells(this,table,local_3c,local_40,local_44,local_48,(uint)((int)uVar2 < (int)uVar1));
      this->anchor = this->position;
      this->adjusted_anchor = this->position;
      QTextDocumentPrivate::endEditBlock(this->priv);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursorPrivate::remove()
{
    if (anchor == position)
        return;
    currentCharFormat = -1;
    int pos1 = position;
    int pos2 = adjusted_anchor;
    QTextUndoCommand::Operation op = QTextUndoCommand::KeepCursor;
    if (pos1 > pos2) {
        pos1 = adjusted_anchor;
        pos2 = position;
        op = QTextUndoCommand::MoveCursor;
    }

    // deleting inside table? -> delete only content
    QTextTable *table = complexSelectionTable();
    if (table) {
        priv->beginEditBlock();
        int startRow, startCol, numRows, numCols;
        selectedTableCells(&startRow, &numRows, &startCol, &numCols);
        clearCells(table, startRow, startCol, numRows, numCols, op);
        adjusted_anchor = anchor = position;
        priv->endEditBlock();
    } else {
        priv->remove(pos1, pos2-pos1, op);
        adjusted_anchor = anchor = position;
    }

}